

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall
CCharmapToLocal::set_mapping(CCharmapToLocal *this,wchar_t unicode_char,uint xlat_offset)

{
  void *pvVar1;
  uint uVar2;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  int i;
  int master_idx;
  undefined4 local_18;
  
  uVar2 = (int)in_ESI >> 8 & 0xff;
  if (*(long *)(in_RDI + 0x10 + (long)(int)uVar2 * 8) == 0) {
    pvVar1 = malloc(0x400);
    *(void **)(in_RDI + 0x10 + (long)(int)uVar2 * 8) = pvVar1;
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10 + (long)(int)uVar2 * 8) + (long)local_18 * 4) = 0;
    }
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x10 + (long)(int)uVar2 * 8) + (long)(int)(in_ESI & 0xff) * 4)
       = in_EDX;
  return;
}

Assistant:

void CCharmapToLocal::set_mapping(wchar_t unicode_char,
                                  unsigned int xlat_offset)
{
    int master_idx;
    
    /* get the master table index for this unicode character */
    master_idx = (int)((unicode_char >> 8) & 0xff);
    
    /* if there's no sub-table here yet, create one */
    if (map_[master_idx] == 0)
    {
        int i;
        
        /* allocate it */
        map_[master_idx] =
            (unsigned int *)t3malloc(256 * sizeof(unsigned int));
        
        /* 
         *   Set each entry to the default character, so that it will
         *   produce valid results if no mapping is ever specified for the
         *   character.  The default character is always at offset zero in
         *   the translation array.  
         */
        for (i = 0 ; i < 256 ; ++i)
            map_[master_idx][i] = 0;
    }
    
    /* set the mapping for the character's entry in the sub-table */
    map_[master_idx][unicode_char & 0xff] = xlat_offset;
}